

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

void __thiscall OpenMesh::PropertyT<int>::push_back(PropertyT<int> *this)

{
  iterator __position;
  int local_c;
  
  local_c = 0;
  __position._M_current =
       (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->data_,__position,&local_c)
    ;
  }
  else {
    *__position._M_current = 0;
    (this->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }